

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O2

void CVmBifTIO::res_exists(uint argc)

{
  int val;
  ushort *puVar1;
  
  CVmBif::check_argc(argc,1);
  puVar1 = (ushort *)CVmBif::pop_str_val();
  val = (*G_host_ifc_X->_vptr_CVmHostIfc[0x10])(G_host_ifc_X,puVar1 + 1,(ulong)*puVar1);
  CVmBif::retval_bool(val);
  return;
}

Assistant:

void CVmBifTIO::res_exists(VMG_ uint argc)
{
    const char *res_name;
    int result;

    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* pop the resource name */
    res_name = pop_str_val(vmg0_);

    /* ask the host application if the resource can be loaded */
    result = G_host_ifc->resfile_exists(res_name + VMB_LEN, osrp2(res_name));

    /* return the result */
    retval_bool(vmg_ result);
}